

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::DragBehavior(ImGuiID id,ImGuiDataType data_type,void *v,float v_speed,void *v_min,
                        void *v_max,char *format,float power,ImGuiDragFlags flags)

{
  ImGuiContext *pIVar1;
  undefined8 *in_RCX;
  undefined4 in_ESI;
  ImGuiID in_EDI;
  undefined8 *in_R8;
  float in_XMM0_Da;
  ImGuiContext *g;
  ImGuiDragFlags in_stack_ffffffffffffff08;
  float in_stack_ffffffffffffff0c;
  char *in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  float fVar2;
  float v_min_00;
  undefined8 in_stack_ffffffffffffff20;
  float power_00;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  ImGuiDataType data_type_00;
  double in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  undefined8 in_stack_ffffffffffffff40;
  float v_speed_00;
  double *in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  longlong *v_00;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  unsigned_long_long in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  float in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  ImGuiDataType in_stack_ffffffffffffff80;
  bool local_1;
  
  pIVar1 = GImGui;
  v_speed_00 = (float)((ulong)in_stack_ffffffffffffff40 >> 0x20);
  fVar2 = (float)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  if (GImGui->ActiveId == in_EDI) {
    if ((GImGui->ActiveIdSource == ImGuiInputSource_Mouse) &&
       (((GImGui->IO).MouseDown[0] & 1U) == 0)) {
      ClearActiveID();
    }
    else if ((GImGui->ActiveIdSource == ImGuiInputSource_Nav) &&
            ((GImGui->NavActivatePressedId == in_EDI &&
             ((GImGui->ActiveIdIsJustActivated & 1U) == 0)))) {
      ClearActiveID();
    }
  }
  if (pIVar1->ActiveId == in_EDI) {
    v_min_00 = (float)in_stack_ffffffffffffff20;
    power_00 = (float)((ulong)in_stack_ffffffffffffff20 >> 0x20);
    data_type_00 = SUB84(in_stack_ffffffffffffff30,0);
    switch(in_ESI) {
    case 0:
      local_1 = DragBehaviorT<int,int,float>
                          (data_type_00,
                           (int *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                           power_00,(int)v_min_00,(int)fVar2,in_stack_ffffffffffffff10,
                           in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08);
      break;
    case 1:
      local_1 = DragBehaviorT<unsigned_int,int,float>
                          (data_type_00,
                           (uint *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                           power_00,(uint)v_min_00,(uint)fVar2,in_stack_ffffffffffffff10,
                           in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08);
      break;
    case 2:
      if (in_RCX == (undefined8 *)0x0) {
        v_00 = (longlong *)0x8000000000000000;
      }
      else {
        v_00 = (longlong *)*in_RCX;
      }
      if (in_R8 == (undefined8 *)0x0) {
        fVar2 = NAN;
      }
      else {
        fVar2 = (float)((ulong)*in_R8 >> 0x20);
      }
      local_1 = DragBehaviorT<long_long,long_long,double>
                          ((ImGuiDataType)v_00,v_00,fVar2,
                           CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                           (longlong)in_stack_ffffffffffffff30,
                           (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                           power_00,(ImGuiDragFlags)v_min_00);
      break;
    case 3:
      local_1 = DragBehaviorT<unsigned_long_long,long_long,double>
                          (in_stack_ffffffffffffff80,
                           (unsigned_long_long *)
                           CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                           in_stack_ffffffffffffff74,
                           CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                           in_stack_ffffffffffffff60,
                           (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                           (float)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                           (ImGuiDataType)in_stack_ffffffffffffff50);
      break;
    case 4:
      local_1 = DragBehaviorT<float,float,float>
                          (data_type_00,
                           (float *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                           power_00,v_min_00,fVar2,in_stack_ffffffffffffff10,in_XMM0_Da,
                           in_stack_ffffffffffffff08);
      break;
    case 5:
      local_1 = DragBehaviorT<double,double,double>
                          ((ImGuiDataType)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                           v_speed_00,
                           (double)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                           in_stack_ffffffffffffff30,
                           (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                           power_00,(ImGuiDragFlags)v_min_00);
      break;
    case 6:
    default:
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::DragBehavior(ImGuiID id, ImGuiDataType data_type, void* v, float v_speed, const void* v_min, const void* v_max, const char* format, float power, ImGuiDragFlags flags)
{
    ImGuiContext& g = *GImGui;
    if (g.ActiveId == id)
    {
        if (g.ActiveIdSource == ImGuiInputSource_Mouse && !g.IO.MouseDown[0])
            ClearActiveID();
        else if (g.ActiveIdSource == ImGuiInputSource_Nav && g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            ClearActiveID();
    }
    if (g.ActiveId != id)
        return false;

    switch (data_type)
    {
    case ImGuiDataType_S32:    return DragBehaviorT<ImS32, ImS32, float >(data_type, (ImS32*)v,  v_speed, v_min ? *(const ImS32* )v_min : IM_S32_MIN, v_max ? *(const ImS32* )v_max : IM_S32_MAX, format, power, flags);
    case ImGuiDataType_U32:    return DragBehaviorT<ImU32, ImS32, float >(data_type, (ImU32*)v,  v_speed, v_min ? *(const ImU32* )v_min : IM_U32_MIN, v_max ? *(const ImU32* )v_max : IM_U32_MAX, format, power, flags);
    case ImGuiDataType_S64:    return DragBehaviorT<ImS64, ImS64, double>(data_type, (ImS64*)v,  v_speed, v_min ? *(const ImS64* )v_min : IM_S64_MIN, v_max ? *(const ImS64* )v_max : IM_S64_MAX, format, power, flags);
    case ImGuiDataType_U64:    return DragBehaviorT<ImU64, ImS64, double>(data_type, (ImU64*)v,  v_speed, v_min ? *(const ImU64* )v_min : IM_U64_MIN, v_max ? *(const ImU64* )v_max : IM_U64_MAX, format, power, flags);
    case ImGuiDataType_Float:  return DragBehaviorT<float, float, float >(data_type, (float*)v,  v_speed, v_min ? *(const float* )v_min : -FLT_MAX,   v_max ? *(const float* )v_max : FLT_MAX,    format, power, flags);
    case ImGuiDataType_Double: return DragBehaviorT<double,double,double>(data_type, (double*)v, v_speed, v_min ? *(const double*)v_min : -DBL_MAX,   v_max ? *(const double*)v_max : DBL_MAX,    format, power, flags);
    case ImGuiDataType_COUNT:  break;
    }
    IM_ASSERT(0);
    return false;
}